

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_disableSimplifierAndScaler(SoPlexBase<double> *this)

{
  SoPlexBase<double> *this_local;
  
  this->_simplifier = (SPxSimplifier<double> *)0x0;
  if ((this->_isRealLPScaled & 1U) == 0) {
    this->_scaler = (SPxScaler<double> *)0x0;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_disableSimplifierAndScaler()
{
   _simplifier = nullptr;
#ifdef SOPLEX_WITH_MPFR
   _boostedSimplifier = nullptr;
#endif

   // preserve scaler when persistent scaling is used
   if(!_isRealLPScaled)
   {
      _scaler = nullptr;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = nullptr;
#endif
   }
   else
      assert(boolParam(SoPlexBase<R>::PERSISTENTSCALING));
}